

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

int sznet::net::sockets::sz_sock_geterror(sz_sock sockfd)

{
  int iVar1;
  socklen_t local_10;
  int local_c;
  socklen_t optlen;
  int optval;
  
  local_10 = 4;
  iVar1 = getsockopt(sockfd,1,4,&local_c,&local_10);
  if (iVar1 < 0) {
    local_c = sz_getlasterr();
  }
  return local_c;
}

Assistant:

int sz_sock_geterror(sz_sock sockfd)
{
	int optval;
	socklen_t optlen = static_cast<socklen_t>(sizeof(optval));
	if (::getsockopt(sockfd, SOL_SOCKET, SO_ERROR, (char*)&optval, &optlen) < 0)
	{
		return sz_getlasterr();
	}
	else
	{
		return optval;
	}
}